

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O2

unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
__thiscall
duckdb::Binder::BindLimit(Binder *this,OrderBinder *order_binder,LimitModifier *limit_mod)

{
  ParsedExpression *pPVar1;
  pointer pBVar2;
  long in_RCX;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_60;
  _Head_base<0UL,_duckdb::BoundLimitModifier_*,_false> local_58;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_50;
  BoundLimitNode local_48;
  
  make_uniq<duckdb::BoundLimitModifier>();
  pPVar1 = *(ParsedExpression **)(in_RCX + 0x10);
  if (pPVar1 != (ParsedExpression *)0x0) {
    *(undefined8 *)(in_RCX + 0x10) = 0;
    local_60._M_head_impl = pPVar1;
    BindLimitValue(&local_48,(Binder *)order_binder,(OrderBinder *)limit_mod,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_60,false,false);
    pBVar2 = unique_ptr<duckdb::BoundLimitModifier,_std::default_delete<duckdb::BoundLimitModifier>,_true>
             ::operator->((unique_ptr<duckdb::BoundLimitModifier,_std::default_delete<duckdb::BoundLimitModifier>,_true>
                           *)&local_58);
    BoundLimitNode::operator=(&pBVar2->limit_val,&local_48);
    if ((_Head_base<0UL,_duckdb::Expression_*,_false>)
        local_48.expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
      (*((BaseExpression *)
        local_48.expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->_vptr_BaseExpression[1])()
      ;
    }
    local_48.expression.
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    if (local_60._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_60._M_head_impl = (ParsedExpression *)0x0;
  }
  local_50._M_head_impl = *(ParsedExpression **)(in_RCX + 0x18);
  if (local_50._M_head_impl != (ParsedExpression *)0x0) {
    *(undefined8 *)(in_RCX + 0x18) = 0;
    BindLimitValue(&local_48,(Binder *)order_binder,(OrderBinder *)limit_mod,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_50,false,true);
    pBVar2 = unique_ptr<duckdb::BoundLimitModifier,_std::default_delete<duckdb::BoundLimitModifier>,_true>
             ::operator->((unique_ptr<duckdb::BoundLimitModifier,_std::default_delete<duckdb::BoundLimitModifier>,_true>
                           *)&local_58);
    BoundLimitNode::operator=(&pBVar2->offset_val,&local_48);
    if (local_48.expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)local_48.expression.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
    }
    local_48.expression.
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    if (local_50._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58._M_head_impl;
  return (unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>_>
         )(unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>_>
           )this;
}

Assistant:

duckdb::unique_ptr<BoundResultModifier> Binder::BindLimit(OrderBinder &order_binder, LimitModifier &limit_mod) {
	auto result = make_uniq<BoundLimitModifier>();
	if (limit_mod.limit) {
		result->limit_val = BindLimitValue(order_binder, std::move(limit_mod.limit), false, false);
	}
	if (limit_mod.offset) {
		result->offset_val = BindLimitValue(order_binder, std::move(limit_mod.offset), false, true);
	}
	return std::move(result);
}